

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,1,1>::accumulateDerivativesImpl<false,false,true>
          (BeagleCPUImpl<double,1,1> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  
  auVar3 = ZEXT816(0) << 0x40;
  for (uVar2 = 0; (~((int)*(uint *)(this + 0x14) >> 0x1f) & *(uint *)(this + 0x14)) != uVar2;
      uVar2 = uVar2 + 1) {
    dVar4 = *(double *)(*(long *)(this + 0x100) + uVar2 * 8) /
            *(double *)(*(long *)(this + 0xf8) + uVar2 * 8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x80) + uVar2 * 8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar4 * dVar4;
    auVar3 = vfmadd231sd_fma(auVar3,auVar5,auVar1);
  }
  *outSumSquaredDerivatives = auVar3._0_8_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}